

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_reader_init_cfile
                  (mz_zip_archive *pZip,FILE *pFile,mz_uint64 archive_size,mz_uint flags)

{
  int iVar1;
  mz_bool mVar2;
  mz_uint64 mVar3;
  __off_t _Var4;
  mz_uint64 cur_file_ofs;
  mz_uint64 mStack_50;
  mz_uint flags_local;
  mz_uint64 archive_size_local;
  FILE *pFile_local;
  mz_zip_archive *pZip_local;
  
  if ((pZip == (mz_zip_archive *)0x0) || (pFile == (FILE *)0x0)) {
    if (pZip != (mz_zip_archive *)0x0) {
      pZip->m_last_error = MZ_ZIP_FILE_OPEN_FAILED;
    }
    return 0;
  }
  mVar3 = ftello((FILE *)pFile);
  mStack_50 = archive_size;
  if (archive_size == 0) {
    iVar1 = fseeko((FILE *)pFile,0,2);
    if (iVar1 != 0) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_FILE_SEEK_FAILED;
      }
      return 0;
    }
    _Var4 = ftello((FILE *)pFile);
    mStack_50 = _Var4 - mVar3;
    if (mStack_50 < 0x16) {
      if (pZip != (mz_zip_archive *)0x0) {
        pZip->m_last_error = MZ_ZIP_NOT_AN_ARCHIVE;
      }
      return 0;
    }
  }
  mVar2 = mz_zip_reader_init_internal(pZip,flags);
  if (mVar2 == 0) {
    pZip_local._0_4_ = 0;
  }
  else {
    pZip->m_zip_type = MZ_ZIP_TYPE_CFILE;
    pZip->m_pRead = mz_zip_file_read_func;
    pZip->m_pIO_opaque = pZip;
    pZip->m_pState->m_pFile = pFile;
    pZip->m_archive_size = mStack_50;
    pZip->m_pState->m_file_archive_start_ofs = mVar3;
    mVar2 = mz_zip_reader_read_central_dir(pZip,flags);
    if (mVar2 == 0) {
      mz_zip_reader_end_internal(pZip,0);
      pZip_local._0_4_ = 0;
    }
    else {
      pZip_local._0_4_ = 1;
    }
  }
  return (mz_bool)pZip_local;
}

Assistant:

mz_bool mz_zip_reader_init_cfile(mz_zip_archive *pZip, MZ_FILE *pFile, mz_uint64 archive_size, mz_uint flags)
{
    mz_uint64 cur_file_ofs;

    if ((!pZip) || (!pFile))
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_OPEN_FAILED);

    cur_file_ofs = MZ_FTELL64(pFile);

    if (!archive_size)
    {
        if (MZ_FSEEK64(pFile, 0, SEEK_END))
            return mz_zip_set_error(pZip, MZ_ZIP_FILE_SEEK_FAILED);

        archive_size = MZ_FTELL64(pFile) - cur_file_ofs;

        if (archive_size < MZ_ZIP_END_OF_CENTRAL_DIR_HEADER_SIZE)
            return mz_zip_set_error(pZip, MZ_ZIP_NOT_AN_ARCHIVE);
    }

    if (!mz_zip_reader_init_internal(pZip, flags))
        return MZ_FALSE;

    pZip->m_zip_type = MZ_ZIP_TYPE_CFILE;
    pZip->m_pRead = mz_zip_file_read_func;

    pZip->m_pIO_opaque = pZip;
    pZip->m_pState->m_pFile = pFile;
    pZip->m_archive_size = archive_size;
    pZip->m_pState->m_file_archive_start_ofs = cur_file_ofs;

    if (!mz_zip_reader_read_central_dir(pZip, flags))
    {
        mz_zip_reader_end_internal(pZip, MZ_FALSE);
        return MZ_FALSE;
    }

    return MZ_TRUE;
}